

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O0

int ddWindow2(DdManager *table,int low,int high)

{
  bool bVar1;
  int iVar2;
  int local_28;
  int size;
  int res;
  int x;
  int high_local;
  int low_local;
  DdManager *table_local;
  
  if (high - low < 1) {
    table_local._4_4_ = 0;
  }
  else {
    local_28 = table->keys - table->isolated;
    for (size = low; size < high; size = size + 1) {
      iVar2 = cuddSwapInPlace(table,size,size + 1);
      if (iVar2 == 0) {
        return 0;
      }
      bVar1 = local_28 <= iVar2;
      local_28 = iVar2;
      if ((bVar1) && (local_28 = cuddSwapInPlace(table,size,size + 1), local_28 == 0)) {
        return 0;
      }
    }
    table_local._4_4_ = 1;
  }
  return table_local._4_4_;
}

Assistant:

static int
ddWindow2(
  DdManager * table,
  int  low,
  int  high)
{

    int x;
    int res;
    int size;

#ifdef DD_DEBUG
    assert(low >= 0 && high < table->size);
#endif

    if (high-low < 1) return(0);

    res = table->keys - table->isolated;
    for (x = low; x < high; x++) {
        size = res;
        res = cuddSwapInPlace(table,x,x+1);
        if (res == 0) return(0);
        if (res >= size) { /* no improvement: undo permutation */
            res = cuddSwapInPlace(table,x,x+1);
            if (res == 0) return(0);
        }
#ifdef DD_STATS
        if (res < size) {
            (void) fprintf(table->out,"-");
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    return(1);

}